

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
Player::action(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Player *this,int choice)

{
  vector<int,_std::allocator<int>_> local_a8;
  vector<int,_std::allocator<int>_> local_90;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> local_38;
  undefined1 local_1d;
  int local_1c;
  Player *pPStack_18;
  int choice_local;
  Player *this_local;
  vector<int,_std::allocator<int>_> *vec1;
  
  local_1d = 0;
  local_1c = choice;
  pPStack_18 = this;
  this_local = (Player *)__return_storage_ptr__;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  if (local_1c == 0) {
    move(&local_38,this,1,0);
    std::vector<int,_std::allocator<int>_>::operator=(__return_storage_ptr__,&local_38);
    std::vector<int,_std::allocator<int>_>::~vector(&local_38);
  }
  else if (local_1c == 1) {
    move(&local_60,this,-1,0);
    std::vector<int,_std::allocator<int>_>::operator=(__return_storage_ptr__,&local_60);
    std::vector<int,_std::allocator<int>_>::~vector(&local_60);
  }
  else if (local_1c == 2) {
    move(&local_78,this,0,1);
    std::vector<int,_std::allocator<int>_>::operator=(__return_storage_ptr__,&local_78);
    std::vector<int,_std::allocator<int>_>::~vector(&local_78);
  }
  else if (local_1c == 3) {
    move(&local_90,this,0,-1);
    std::vector<int,_std::allocator<int>_>::operator=(__return_storage_ptr__,&local_90);
    std::vector<int,_std::allocator<int>_>::~vector(&local_90);
  }
  else {
    move(&local_a8,this,0,0);
    std::vector<int,_std::allocator<int>_>::operator=(__return_storage_ptr__,&local_a8);
    std::vector<int,_std::allocator<int>_>::~vector(&local_a8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> Player::action(int choice)
{
    std::vector<int> vec1;
    if (choice == 0)
    {
        vec1 = this->move(1, 0);
    }
    else if (choice == 1)
    {
        vec1 = this->move(-1, 0);
    }
    else if (choice == 2)
    {
        vec1 = this->move(0, 1);
    }
    else if (choice == 3)
    {
        vec1 = this->move(0, -1);
    }
    else
    {
        vec1 = this->move(0, 0);
    }
    /**
    else if (choice == 4)
    {
        vec1 = this->move(0, 0, 1);
    }
    else if (choice == 5)
    {
        vec1 = this->move(0, 0, -1); //Looks good
     }
     **/
    return vec1;
}